

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

int jx9Builtin_ctype_alpha(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  jx9_value *pObj;
  undefined8 in_RAX;
  byte *pbVar1;
  ushort **ppuVar2;
  byte *pbVar3;
  jx9_real jVar4;
  int nLen;
  int local_24;
  
  local_24 = (int)((ulong)in_RAX >> 0x20);
  if (0 < nArg) {
    pbVar1 = (byte *)jx9_value_to_string(*apArg,&local_24);
    if (0 < (long)local_24) {
      pbVar3 = pbVar1 + local_24;
      ppuVar2 = __ctype_b_loc();
      jVar4 = 0.0;
      do {
        if ((*(byte *)((long)*ppuVar2 + (ulong)*pbVar1 * 2 + 1) & 4) == 0) goto LAB_00133ba7;
        pbVar1 = pbVar1 + 1;
      } while (pbVar1 < pbVar3);
      jVar4 = 4.94065645841247e-324;
      goto LAB_00133ba7;
    }
  }
  jVar4 = 0.0;
LAB_00133ba7:
  pObj = pCtx->pRet;
  jx9MemObjRelease(pObj);
  (pObj->x).rVal = jVar4;
  pObj->iFlags = pObj->iFlags & 0xfffffe90U | 8;
  return 0;
}

Assistant:

static int jx9Builtin_ctype_alpha(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	const unsigned char *zIn, *zEnd;
	int nLen;
	if( nArg < 1 ){
		/* Missing arguments, return FALSE */
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Extract the target string */
	zIn  = (const unsigned char *)jx9_value_to_string(apArg[0], &nLen);
	zEnd = &zIn[nLen];
	if( nLen < 1 ){
		/* Empty string, return FALSE */
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Perform the requested operation */
	for(;;){
		if( zIn >= zEnd ){
			/* If we reach the end of the string, then the test succeeded. */
			jx9_result_bool(pCtx, 1);
			return JX9_OK;
		}
		if( !SyisAlpha(zIn[0]) ){
			break;
		}
		/* Point to the next character */
		zIn++;
	}
	/* The test failed, return FALSE */
	jx9_result_bool(pCtx, 0);
	return JX9_OK;
}